

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildObject(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_50;
  undefined1 local_21;
  Object *local_20;
  Object *object_local;
  cmFileAPI *this_local;
  Value *value;
  
  local_21 = 0;
  local_20 = object;
  object_local = (Object *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  switch(local_20->Kind) {
  case CodeModel:
    BuildCodeModel(&local_50,this,local_20);
    Json::Value::operator=(__return_storage_ptr__,&local_50);
    Json::Value::~Value(&local_50);
    break;
  case Cache:
    BuildCache(&local_88,this,local_20);
    Json::Value::operator=(__return_storage_ptr__,&local_88);
    Json::Value::~Value(&local_88);
    break;
  case CMakeFiles:
    BuildCMakeFiles(&local_b0,this,local_20);
    Json::Value::operator=(__return_storage_ptr__,&local_b0);
    Json::Value::~Value(&local_b0);
    break;
  case InternalTest:
    BuildInternalTest(&local_d8,this,local_20);
    Json::Value::operator=(__return_storage_ptr__,&local_d8);
    Json::Value::~Value(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildObject(Object const& object)
{
  Json::Value value;

  switch (object.Kind) {
    case ObjectKind::CodeModel:
      value = this->BuildCodeModel(object);
      break;
    case ObjectKind::Cache:
      value = this->BuildCache(object);
      break;
    case ObjectKind::CMakeFiles:
      value = this->BuildCMakeFiles(object);
      break;
    case ObjectKind::InternalTest:
      value = this->BuildInternalTest(object);
      break;
  }

  return value;
}